

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqldatabase.cpp
# Opt level: O2

bool __thiscall QSqlDatabase::moveToThread(QSqlDatabase *this,QThread *targetThread)

{
  QSqlDriver *pQVar1;
  undefined1 uVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d->driver;
  if (pQVar1 != (QSqlDriver *)0x0) {
    QSqlDatabasePrivate::shared_null();
    if (pQVar1 != QSqlDatabasePrivate::shared_null::n.driver) {
      if ((this->d->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i < 3) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          uVar2 = QObject::moveToThread(pQVar1,targetThread);
          return (bool)uVar2;
        }
        goto LAB_00119fa0;
      }
      local_40[0] = '\x02';
      local_40[1] = '\0';
      local_40[2] = '\0';
      local_40[3] = '\0';
      local_40[0x14] = '\0';
      local_40[0x15] = '\0';
      local_40[0x16] = '\0';
      local_40[0x17] = '\0';
      local_40[4] = '\0';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      local_40[8] = '\0';
      local_40[9] = '\0';
      local_40[10] = '\0';
      local_40[0xb] = '\0';
      local_40[0xc] = '\0';
      local_40[0xd] = '\0';
      local_40[0xe] = '\0';
      local_40[0xf] = '\0';
      local_40[0x10] = '\0';
      local_40[0x11] = '\0';
      local_40[0x12] = '\0';
      local_40[0x13] = '\0';
      local_28 = "default";
      uVar3 = QString::utf16();
      QMessageLogger::warning
                (local_40,
                 "QSqlDatabasePrivate::moveToThread: connection \'%ls\' is still in use in the current thread."
                 ,uVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return false;
  }
LAB_00119fa0:
  __stack_chk_fail();
}

Assistant:

bool QSqlDatabase::moveToThread(QThread *targetThread)
{
    if (auto drv = driver()) {
        if (drv != QSqlDatabasePrivate::shared_null()->driver) {
            // two instances are alive - the one here and the one in dbDict()
            if (d->ref.loadRelaxed() > 2) {
                qWarning("QSqlDatabasePrivate::moveToThread: connection '%ls' is still in use "
                         "in the current thread.", qUtf16Printable(d->connName));
                return false;
            }
            return drv->moveToThread(targetThread);
        }
    }
    return false;
}